

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAi_kry.c
# Opt level: O1

sunrealtype doubleIntgr(N_Vector c,int i,WebData wdata)

{
  uint uVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  undefined4 in_register_00000034;
  long lVar8;
  ulong uVar9;
  int iVar10;
  double *pdVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  lVar8 = CONCAT44(in_register_00000034,i);
  lVar5 = N_VGetArrayPointer();
  iVar3 = *(int *)(lVar8 + 0x40);
  iVar10 = *(int *)(lVar8 + 0x50);
  dVar16 = *(double *)(lVar5 + 0x28);
  uVar9 = (ulong)(iVar10 - 1U);
  if (2 < iVar10) {
    pdVar11 = (double *)(lVar5 + (long)iVar3 * 8 + 0x28);
    lVar13 = uVar9 - 1;
    do {
      dVar16 = dVar16 + *pdVar11 + *pdVar11;
      pdVar11 = pdVar11 + iVar3;
      lVar13 = lVar13 + -1;
    } while (lVar13 != 0);
  }
  iVar12 = *(int *)(lVar8 + 0x44);
  iVar6 = (iVar10 - 1U) * iVar3;
  dVar17 = *(double *)(lVar8 + 0x310) * 0.5;
  iVar7 = iVar6 + 5;
  dVar16 = (dVar16 + *(double *)(lVar5 + 0x28 + (long)iVar6 * 8)) * dVar17;
  uVar1 = *(int *)(lVar8 + 0x54) - 1;
  if (2 < *(int *)(lVar8 + 0x54)) {
    iVar6 = iVar12 + iVar3 + 5;
    uVar14 = 1;
    do {
      dVar15 = *(double *)(lVar5 + 0x28 + uVar14 * (long)iVar12 * 8);
      lVar13 = uVar9 - 1;
      iVar4 = iVar6;
      if (2 < iVar10) {
        do {
          dVar2 = *(double *)(lVar5 + (long)iVar4 * 8);
          dVar15 = dVar15 + dVar2 + dVar2;
          lVar13 = lVar13 + -1;
          iVar4 = iVar4 + iVar3;
        } while (lVar13 != 0);
      }
      dVar15 = (dVar15 + *(double *)(lVar5 + (long)iVar7 * 8 + uVar14 * (long)iVar12 * 8)) * dVar17;
      dVar16 = dVar16 + dVar15 + dVar15;
      uVar14 = uVar14 + 1;
      iVar6 = iVar6 + iVar12;
    } while (uVar14 != uVar1);
  }
  iVar12 = uVar1 * iVar12;
  dVar15 = *(double *)(lVar5 + 0x28 + (long)iVar12 * 8);
  if (2 < iVar10) {
    iVar10 = iVar3 + iVar12 + 5;
    lVar13 = uVar9 - 1;
    do {
      dVar2 = *(double *)(lVar5 + (long)iVar10 * 8);
      dVar15 = dVar15 + dVar2 + dVar2;
      iVar10 = iVar10 + iVar3;
      lVar13 = lVar13 + -1;
    } while (lVar13 != 0);
  }
  return *(double *)(lVar8 + 0x318) * 0.5 *
         (dVar16 + dVar17 * (dVar15 + *(double *)(lVar5 + (long)(iVar7 + iVar12) * 8)));
}

Assistant:

static sunrealtype doubleIntgr(N_Vector c, int i, WebData wdata)
{
  sunrealtype* cdata;
  int ns, mx, my, mxns;
  sunrealtype dx, dy;
  sunrealtype intgr_xy, intgr_x;
  int jx, jy;

  cdata = N_VGetArrayPointer(c);

  ns   = wdata->ns;
  mx   = wdata->mx;
  my   = wdata->my;
  mxns = wdata->mxns;
  dx   = wdata->dx;
  dy   = wdata->dy;

  jy      = 0;
  intgr_x = cdata[(i - 1) + jy * mxns];
  for (jx = 1; jx < mx - 1; jx++)
  {
    intgr_x += TWO * cdata[(i - 1) + jx * ns + jy * mxns];
  }
  intgr_x += cdata[(i - 1) + (mx - 1) * ns + jy * mxns];
  intgr_x *= SUN_RCONST(0.5) * dx;

  intgr_xy = intgr_x;

  for (jy = 1; jy < my - 1; jy++)
  {
    intgr_x = cdata[(i - 1) + jy * mxns];
    for (jx = 1; jx < mx - 1; jx++)
    {
      intgr_x += TWO * cdata[(i - 1) + jx * ns + jy * mxns];
    }
    intgr_x += cdata[(i - 1) + (mx - 1) * ns + jy * mxns];
    intgr_x *= SUN_RCONST(0.5) * dx;

    intgr_xy += TWO * intgr_x;
  }

  jy      = my - 1;
  intgr_x = cdata[(i - 1) + jy * mxns];
  for (jx = 1; jx < mx - 1; jx++)
  {
    intgr_x += TWO * cdata[(i - 1) + jx * ns + jy * mxns];
  }
  intgr_x += cdata[(i - 1) + (mx - 1) * ns + jy * mxns];
  intgr_x *= SUN_RCONST(0.5) * dx;

  intgr_xy += intgr_x;

  intgr_xy *= SUN_RCONST(0.5) * dy;

  return (intgr_xy);
}